

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_hash_set * ggml_hash_set_new(size_t size)

{
  size_t n;
  ggml_tensor **ppgVar1;
  ggml_bitset_t *pgVar2;
  size_t in_RSI;
  ggml_hash_set *in_RDI;
  ggml_hash_set *size_00;
  
  size_00 = in_RDI;
  n = ggml_hash_size(in_RSI);
  in_RDI->size = n;
  ppgVar1 = (ggml_tensor **)ggml_malloc((size_t)in_RDI);
  in_RDI->keys = ppgVar1;
  ggml_bitset_size(n);
  pgVar2 = (ggml_bitset_t *)ggml_calloc(n,(size_t)size_00);
  in_RDI->used = pgVar2;
  return size_00;
}

Assistant:

struct ggml_hash_set ggml_hash_set_new(size_t size) {
    size = ggml_hash_size(size);
    struct ggml_hash_set result;
    result.size = size;
    result.keys = GGML_MALLOC(sizeof(struct ggml_tensor *) * size);
    result.used = GGML_CALLOC(ggml_bitset_size(size), sizeof(ggml_bitset_t));
    return result;
}